

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  uint uVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  uint _w;
  Layer *pLVar7;
  undefined4 *puVar8;
  ulong uVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  ulong uVar12;
  undefined4 *puVar13;
  int _elempack;
  ulong uVar15;
  ParamDict pd;
  Mat local_78;
  ulong uVar14;
  
  pLVar7 = create_layer(0xe);
  this->flatten = pLVar7;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    p_Var3 = this->_vptr_InnerProduct_x86_avx[-3];
    uVar1 = *(uint *)(p_Var3 + 0x28 + (long)&(this->weight_data_int8).data);
    _w = *(int *)(p_Var3 + 0x30 + (long)&(this->weight_data_int8).data) / (int)uVar1;
    uVar14 = 1;
    if (opt->use_packing_layout == true) {
      uVar14 = 8;
      if ((uVar1 & 7) != 0) {
        uVar14 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
      }
    }
    _elempack = (int)uVar14;
    if (_elempack != 1) {
      p_Var3 = this->_vptr_InnerProduct_x86_avx[-3];
      Mat::reshape(&local_78,(Mat *)(p_Var3 + 0x40 + (long)&(this->scales_in).data),_w,
                   *(int *)(p_Var3 + 0x28 + (long)&(this->weight_data_int8).data),(Allocator *)0x0);
      Mat::create(&this->weight_data_packed,_w,
                  *(int *)(this->_vptr_InnerProduct_x86_avx[-3] + 0x28 +
                          (long)&(this->weight_data_int8).data) / _elempack,
                  (ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
      pp_Var4 = this->_vptr_InnerProduct_x86_avx;
      if (_elempack <= *(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data)) {
        pvVar5 = (this->weight_data_packed).data;
        iVar2 = (this->weight_data_packed).w;
        sVar6 = (this->weight_data_packed).elemsize;
        uVar9 = 0;
        puVar11 = (undefined4 *)local_78.data;
        do {
          if (0 < (int)_w) {
            puVar8 = (undefined4 *)
                     ((long)(int)((uVar9 & 0xffffffff) / uVar14) * (long)iVar2 * sVar6 +
                     (long)pvVar5);
            uVar12 = 0;
            puVar10 = puVar11;
            uVar15 = uVar14;
            puVar13 = puVar11;
            do {
              do {
                *puVar8 = *puVar10;
                puVar8 = puVar8 + 1;
                uVar15 = uVar15 - 1;
                puVar10 = (undefined4 *)((long)puVar10 + (long)local_78.w * local_78.elemsize);
              } while (uVar15 != 0);
              uVar12 = uVar12 + 1;
              puVar10 = puVar13 + 1;
              uVar15 = uVar14;
              puVar13 = puVar10;
            } while (uVar12 != _w);
          }
          uVar9 = uVar9 + uVar14;
          puVar11 = (undefined4 *)((long)puVar11 + (long)local_78.w * local_78.elemsize * uVar14);
        } while ((long)(uVar9 + (_elempack - 1)) <
                 (long)*(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data));
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}